

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BindDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BindDirectiveSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::syntax::BindTargetListSyntax*&,slang::syntax::MemberSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,NameSyntax *args_2,BindTargetListSyntax **args_3,MemberSyntax *args_4)

{
  Token bind;
  BindDirectiveSyntax *targetInstances;
  Info *in_RCX;
  undefined8 *in_RDX;
  MemberSyntax *in_RSI;
  undefined8 in_R8;
  BindDirectiveSyntax *in_R9;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  targetInstances =
       (BindDirectiveSyntax *)
       allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bind.info = in_RCX;
  bind.kind = (short)in_R8;
  bind._2_1_ = (char)((ulong)in_R8 >> 0x10);
  bind.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  bind.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::BindDirectiveSyntax::BindDirectiveSyntax
            (in_R9,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDX[1],bind,
             (NameSyntax *)*in_RDX,(BindTargetListSyntax *)targetInstances,in_RSI);
  return targetInstances;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }